

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

bool __thiscall asmjit::StringBuilder::eq(StringBuilder *this,char *str,size_t len)

{
  ulong __n;
  int iVar1;
  ulong in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  size_t i;
  size_t bLength;
  size_t aLength;
  char *bData;
  char *aData;
  ulong local_48;
  bool local_1;
  
  __n = in_RDI[1];
  if (in_RDX == 0xffffffffffffffff) {
    for (local_48 = 0; local_48 < __n; local_48 = local_48 + 1) {
      if ((*(char *)((long)*in_RDI + local_48) != *(char *)((long)in_RSI + local_48)) ||
         (*(char *)((long)in_RSI + local_48) == '\0')) {
        return false;
      }
    }
    local_1 = *(char *)((long)in_RSI + local_48) == '\0';
  }
  else if (__n == in_RDX) {
    iVar1 = memcmp((void *)*in_RDI,in_RSI,__n);
    local_1 = iVar1 == 0;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool StringBuilder::eq(const char* str, size_t len) const noexcept {
  const char* aData = _data;
  const char* bData = str;

  size_t aLength = _length;
  size_t bLength = len;

  if (bLength == Globals::kInvalidIndex) {
    size_t i;
    for (i = 0; i < aLength; i++)
      if (aData[i] != bData[i] || bData[i] == 0)
        return false;
    return bData[i] == 0;
  }
  else {
    if (aLength != bLength)
      return false;
    return ::memcmp(aData, bData, aLength) == 0;
  }
}